

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCheck.hpp
# Opt level: O3

void FMB::ModelCheck::doCheck(UnitList *units)

{
  Connective CVar1;
  int iVar2;
  Unit *pUVar3;
  Cell *pCVar4;
  Term *this;
  char cVar5;
  size_t i;
  long lVar6;
  ostream *poVar7;
  Formula *pFVar8;
  Set<Kernel::Term_*,_Lib::DefaultHash> *pSVar9;
  long *plVar10;
  undefined **ppuVar11;
  uint *puVar12;
  Entry *pEVar13;
  long *plVar14;
  int *piVar15;
  undefined8 *puVar16;
  long *plVar17;
  int iVar18;
  uint *res;
  uint uVar19;
  char *pcVar20;
  ulong uVar21;
  UnitList *pUVar22;
  Cell *pCVar23;
  uint uVar24;
  Iterator uit;
  List<Kernel::Unit_*> *pLVar25;
  byte bVar26;
  void **head;
  bool bVar27;
  undefined1 auVar28 [16];
  string name_1;
  bool dummy;
  Set<Kernel::Term_*,_Lib::DefaultHash> domainConstants;
  DArray<unsigned_int> sortSizesArray;
  DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> sortSizes;
  DHMap<Kernel::Term_*,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> domainConstantNumber;
  DHMap<unsigned_int,_std::unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
  domainConstantsPerSort;
  FiniteModelMultiSorted model;
  string local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  _Head_base<0UL,_Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_*,_false> local_250;
  UnitList *local_248;
  undefined1 local_240 [16];
  undefined1 local_230 [32];
  Cell *local_210;
  undefined8 *local_208;
  DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> local_200;
  long *local_1d8 [2];
  long local_1c8 [2];
  DHMap<Kernel::Term_*,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> local_1b8;
  DArray<unsigned_int> local_190;
  DHMap<unsigned_int,_std::unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
  local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  undefined1 local_110 [224];
  
  local_200._timestamp = 1;
  local_200._size = 0;
  local_200._deleted = 0;
  local_200._capacityIndex = 0;
  local_200._capacity = 0;
  local_200._20_8_ = 0;
  local_200._28_8_ = 0;
  local_200._afterLast._4_4_ = 0;
  local_178._timestamp = 1;
  local_178._size = 0;
  local_178._deleted = 0;
  local_178._capacityIndex = 0;
  local_178._capacity = 0;
  local_178._20_8_ = 0;
  local_178._28_8_ = 0;
  local_178._afterLast._4_4_ = 0;
  local_248 = units;
  if (units != (UnitList *)0x0) {
    do {
      pUVar3 = units->_head;
      units = units->_tail;
      if (((undefined1  [48])pUVar3->_inference & (undefined1  [48])0x1c) == (undefined1  [48])0x18)
      {
        local_110._0_8_ = local_110 + 0x10;
        local_110._8_8_ = 0;
        local_110[0x10] = '\0';
        Parse::TPTP::findAxiomName(pUVar3,(string *)local_110);
        local_240._0_8_ = (Set<Kernel::Term_*,_Lib::DefaultHash> *)local_230;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"finite_domain","");
        lVar6 = std::__cxx11::string::rfind(local_110,local_240._0_8_,0);
        if ((Set<Kernel::Term_*,_Lib::DefaultHash> *)local_240._0_8_ !=
            (Set<Kernel::Term_*,_Lib::DefaultHash> *)local_230) {
          operator_delete((void *)local_240._0_8_,local_230._0_8_ + 1);
        }
        if (lVar6 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Finite domain axiom found:",0x1a);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
          std::ostream::put('X');
          poVar7 = (ostream *)std::ostream::flush();
          Kernel::Unit::toString_abi_cxx11_((string *)local_240,pUVar3);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(char *)local_240._0_8_,
                              CONCAT44(local_240._12_4_,local_240._8_4_));
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          if ((Set<Kernel::Term_*,_Lib::DefaultHash> *)local_240._0_8_ !=
              (Set<Kernel::Term_*,_Lib::DefaultHash> *)local_230) {
            operator_delete((void *)local_240._0_8_,local_230._0_8_ + 1);
          }
          if ((pUVar3->field_0x4 & 1) == 0) {
            puVar16 = (undefined8 *)__cxa_allocate_exception(0x50);
            *puVar16 = &PTR_cry_00b3dfc0;
            puVar16[1] = puVar16 + 3;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)(puVar16 + 1),"finite_domain in cnf (use fof/tff instead)","");
            *puVar16 = &PTR_cry_00b3e0a8;
            *(undefined4 *)(puVar16 + 5) = 0;
            puVar16[6] = puVar16 + 8;
            puVar16[7] = 0;
            *(undefined1 *)(puVar16 + 8) = 0;
            __cxa_throw(puVar16,&Lib::UserErrorException::typeinfo,
                        Lib::UserErrorException::~UserErrorException);
          }
          pFVar8 = Kernel::Unit::getFormula(pUVar3);
          if (pFVar8->_connective != FORALL) {
            puVar16 = (undefined8 *)__cxa_allocate_exception(0x50);
            *puVar16 = &PTR_cry_00b3dfc0;
            puVar16[1] = puVar16 + 3;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)(puVar16 + 1),"finite_domain is not a domain axiom","");
            *puVar16 = &PTR_cry_00b3e0a8;
            *(undefined4 *)(puVar16 + 5) = 0;
            puVar16[6] = puVar16 + 8;
            puVar16[7] = 0;
            *(undefined1 *)(puVar16 + 8) = 0;
            __cxa_throw(puVar16,&Lib::UserErrorException::typeinfo,
                        Lib::UserErrorException::~UserErrorException);
          }
          lVar6 = *(long *)(pFVar8 + 1);
          if (lVar6 == 0) {
LAB_001a6ee9:
            puVar16 = (undefined8 *)__cxa_allocate_exception(0x50);
            *puVar16 = &PTR_cry_00b3dfc0;
            puVar16[1] = puVar16 + 3;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)(puVar16 + 1),
                       "finite_domain must start with forall over a single variable","");
            *puVar16 = &PTR_cry_00b3e0a8;
            *(undefined4 *)(puVar16 + 5) = 0;
            puVar16[6] = puVar16 + 8;
            puVar16[7] = 0;
            *(undefined1 *)(puVar16 + 8) = 0;
            __cxa_throw(puVar16,&Lib::UserErrorException::typeinfo,
                        Lib::UserErrorException::~UserErrorException);
          }
          piVar15 = (int *)pFVar8[1]._label._M_string_length;
          iVar18 = 1;
          do {
            lVar6 = *(long *)(lVar6 + 8);
            iVar18 = iVar18 + -1;
          } while (lVar6 != 0);
          if (iVar18 != 0) goto LAB_001a6ee9;
          plVar10 = (long *)pFVar8[1]._label._M_dataplus._M_p;
          if (plVar10 == (long *)0x0) {
            uVar19 = Kernel::Signature::getDefaultSort(DAT_00b521b0);
          }
          else {
            uVar19 = *(uint *)(*plVar10 + 8);
          }
          pSVar9 = (Set<Kernel::Term_*,_Lib::DefaultHash> *)
                   Lib::FixedSizeAllocator<48UL>::alloc
                             ((FixedSizeAllocator<48UL> *)
                              (Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
          pSVar9->_capacity = 0;
          pSVar9->_nonemptyCells = 0;
          pSVar9->_size = 0;
          pSVar9->_entries = (Cell *)0x0;
          Lib::Set<Kernel::Term_*,_Lib::DefaultHash>::expand(pSVar9);
          local_1b8._timestamp = 0xffffffff;
          local_240._0_8_ = pSVar9;
          if (*piVar15 == 0) {
            uVar24 = 1;
            checkIsDomainLiteral(*(Literal **)(piVar15 + 10),(int *)&local_1b8,pSVar9);
          }
          else {
            if (*piVar15 != 2) {
              puVar16 = (undefined8 *)__cxa_allocate_exception(0x50);
              *puVar16 = &PTR_cry_00b3dfc0;
              puVar16[1] = puVar16 + 3;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)(puVar16 + 1),"finite_domain is not a domain axiom","");
              *puVar16 = &PTR_cry_00b3e0a8;
              *(undefined4 *)(puVar16 + 5) = 0;
              puVar16[6] = puVar16 + 8;
              puVar16[7] = 0;
              *(undefined1 *)(puVar16 + 8) = 0;
              __cxa_throw(puVar16,&Lib::UserErrorException::typeinfo,
                          Lib::UserErrorException::~UserErrorException);
            }
            puVar16 = *(undefined8 **)(piVar15 + 10);
            uVar24 = 0;
            while (puVar16 != (undefined8 *)0x0) {
              piVar15 = (int *)*puVar16;
              if (*piVar15 != 0) {
                puVar16 = (undefined8 *)__cxa_allocate_exception(0x50);
                *puVar16 = &PTR_cry_00b3dfc0;
                puVar16[1] = puVar16 + 3;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)(puVar16 + 1),"finite_domain is not a domain axiom","");
                *puVar16 = &PTR_cry_00b3e0a8;
                *(undefined4 *)(puVar16 + 5) = 0;
                puVar16[6] = puVar16 + 8;
                puVar16[7] = 0;
                *(undefined1 *)(puVar16 + 8) = 0;
                __cxa_throw(puVar16,&Lib::UserErrorException::typeinfo,
                            Lib::UserErrorException::~UserErrorException);
              }
              puVar16 = (undefined8 *)puVar16[1];
              uVar24 = uVar24 + 1;
              checkIsDomainLiteral
                        (*(Literal **)(piVar15 + 10),(int *)&local_1b8,
                         (Set<Kernel::Term_*,_Lib::DefaultHash> *)local_240._0_8_);
            }
          }
          Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::set
                    (&local_200,uVar19,uVar24);
          local_250._M_head_impl = (Set<Kernel::Term_*,_Lib::DefaultHash> *)local_240._0_8_;
          local_240._0_8_ = (Set<Kernel::Term_*,_Lib::DefaultHash> *)0x0;
          Lib::
          DHMap<unsigned_int,_std::unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
          ::set(&local_178,uVar19,
                (unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>
                 *)&local_250);
          if (local_250._M_head_impl != (Set<Kernel::Term_*,_Lib::DefaultHash> *)0x0) {
            std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>::operator()
                      ((default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_> *)&local_250,
                       local_250._M_head_impl);
          }
          local_250._M_head_impl = (Set<Kernel::Term_*,_Lib::DefaultHash> *)0x0;
          if ((Set<Kernel::Term_*,_Lib::DefaultHash> *)local_240._0_8_ !=
              (Set<Kernel::Term_*,_Lib::DefaultHash> *)0x0) {
            std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>::operator()
                      ((default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_> *)local_240,
                       (Set<Kernel::Term_*,_Lib::DefaultHash> *)local_240._0_8_);
          }
        }
        if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
          operator_delete((void *)local_110._0_8_,CONCAT71(local_110._17_7_,local_110[0x10]) + 1);
        }
      }
    } while (units != (List<Kernel::Unit_*> *)0x0);
    if (local_200._size != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Loading model...",0x10);
      pUVar22 = local_248;
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
      std::ostream::put('X');
      std::ostream::flush();
      local_230._24_8_ =
           (ulong)((long)(DAT_00b521b0->_typeCons)._cursor - (long)(DAT_00b521b0->_typeCons)._stack)
           >> 3 & 0xffffffff;
      local_210 = (Cell *)local_230._24_8_;
      if ((Cell *)local_230._24_8_ == (Cell *)0x0) {
        local_208 = (undefined8 *)0x0;
      }
      else {
        uVar21 = local_230._24_8_ * 4 + 0xfU & 0x7fffffff0;
        if (uVar21 == 0) {
          local_208 = (undefined8 *)
                      Lib::FixedSizeAllocator<8UL>::alloc
                                ((FixedSizeAllocator<8UL> *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR);
        }
        else if (uVar21 < 0x11) {
          local_208 = (undefined8 *)
                      Lib::FixedSizeAllocator<16UL>::alloc
                                ((FixedSizeAllocator<16UL> *)
                                 (Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
        }
        else if (uVar21 < 0x19) {
          local_208 = (undefined8 *)
                      Lib::FixedSizeAllocator<24UL>::alloc
                                ((FixedSizeAllocator<24UL> *)
                                 (Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
        }
        else if (uVar21 < 0x21) {
          local_208 = (undefined8 *)
                      Lib::FixedSizeAllocator<32UL>::alloc
                                ((FixedSizeAllocator<32UL> *)
                                 (Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
        }
        else if (uVar21 < 0x31) {
          local_208 = (undefined8 *)
                      Lib::FixedSizeAllocator<48UL>::alloc
                                ((FixedSizeAllocator<48UL> *)
                                 (Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
        }
        else if (uVar21 < 0x41) {
          local_208 = (undefined8 *)
                      Lib::FixedSizeAllocator<64UL>::alloc
                                ((FixedSizeAllocator<64UL> *)
                                 (Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
        }
        else {
          local_208 = (undefined8 *)::operator_new(uVar21,0x10);
        }
        if (local_210 != (Cell *)0x0) {
          memset(local_208,0,(long)local_210 << 2);
        }
      }
      plVar10 = (long *)::operator_new(0x28);
      ppuVar11 = &PTR__IteratorCore_00b210b8;
      *plVar10 = (long)&PTR__IteratorCore_00b210b8;
      *(undefined4 *)(plVar10 + 2) = local_200._entries._0_4_;
      *(undefined4 *)((long)plVar10 + 0x14) = local_200._entries._4_4_;
      *(undefined4 *)(plVar10 + 3) = local_200._afterLast._0_4_;
      *(undefined4 *)((long)plVar10 + 0x1c) = local_200._afterLast._4_4_;
      *(uint *)(plVar10 + 4) = local_200._timestamp;
      *(undefined4 *)(plVar10 + 1) = 1;
      while (cVar5 = (*(code *)ppuVar11[2])(plVar10), cVar5 != '\0') {
        auVar28 = (**(code **)(*plVar10 + 0x18))(plVar10);
        *(undefined4 *)((long)local_208 + (ulong)*auVar28._0_8_ * 4) = *auVar28._8_8_;
        ppuVar11 = (undefined **)*plVar10;
      }
      plVar14 = plVar10 + 1;
      *(int *)plVar14 = (int)*plVar14 + -1;
      if ((int)*plVar14 == 0) {
        (**(code **)(*plVar10 + 8))(plVar10);
      }
      Lib::DArray<unsigned_int>::DArray(&local_190,(DArray<unsigned_int> *)(local_230 + 0x18));
      FiniteModelMultiSorted::FiniteModelMultiSorted((FiniteModelMultiSorted *)local_110,&local_190)
      ;
      if (local_190._array != (uint *)0x0) {
        uVar21 = local_190._capacity * 4 + 0xf & 0xfffffffffffffff0;
        if (uVar21 == 0) {
          *(undefined8 *)local_190._array = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_190._array;
        }
        else if (uVar21 < 0x11) {
          *(undefined8 *)local_190._array = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_190._array;
        }
        else if (uVar21 < 0x19) {
          *(undefined8 *)local_190._array = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_190._array;
        }
        else if (uVar21 < 0x21) {
          *(undefined8 *)local_190._array = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_190._array;
        }
        else if (uVar21 < 0x31) {
          *(undefined8 *)local_190._array = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_190._array;
        }
        else if (uVar21 < 0x41) {
          *(undefined8 *)local_190._array = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_190._array;
        }
        else {
          operator_delete(local_190._array,0x10);
        }
      }
      local_240._0_8_ = (pointer)0x0;
      local_240._8_4_ = 0;
      local_230._0_8_ = (undefined8 *)0x0;
      Lib::Set<Kernel::Term_*,_Lib::DefaultHash>::expand
                ((Set<Kernel::Term_*,_Lib::DefaultHash> *)local_240);
      local_1b8._timestamp = 1;
      local_1b8._size = 0;
      local_1b8._deleted = 0;
      local_1b8._capacityIndex = 0;
      local_1b8._capacity = 0;
      local_1b8._20_8_ = 0;
      local_1b8._28_8_ = 0;
      local_1b8._afterLast._4_4_ = 0;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Detected model with ",0x14);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," sorts.",7);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      plVar10 = (long *)::operator_new(0x28);
      ppuVar11 = &PTR__IteratorCore_00b210b8;
      *plVar10 = (long)&PTR__IteratorCore_00b210b8;
      *(undefined4 *)(plVar10 + 2) = local_200._entries._0_4_;
      *(undefined4 *)((long)plVar10 + 0x14) = local_200._entries._4_4_;
      *(undefined4 *)(plVar10 + 3) = local_200._afterLast._0_4_;
      *(undefined4 *)((long)plVar10 + 0x1c) = local_200._afterLast._4_4_;
      *(uint *)(plVar10 + 4) = local_200._timestamp;
      *(undefined4 *)(plVar10 + 1) = 1;
      while (cVar5 = (*(code *)ppuVar11[2])(plVar10), cVar5 != '\0') {
        puVar12 = (uint *)(**(code **)(*plVar10 + 0x18))(plVar10);
        local_298._M_dataplus._M_p._0_4_ = *puVar12;
        pEVar13 = Lib::
                  DHMap<unsigned_int,_std::unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
                  ::findEntry(&local_178,(uint *)&local_298);
        pSVar9 = (pEVar13->_val)._M_t.
                 super___uniq_ptr_impl<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_*,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>
                 .super__Head_base<0UL,_Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_*,_false>.
                 _M_head_impl;
        std::operator+(&local_270,"  domain for ",&(DAT_00b521b0->_typeCons)._stack[*puVar12]->_name
                      );
        plVar14 = (long *)std::__cxx11::string::append((char *)&local_270);
        plVar17 = plVar14 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar17) {
          local_298.field_2._M_allocated_capacity = *plVar17;
          local_298.field_2._8_8_ = plVar14[3];
          local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
        }
        else {
          local_298.field_2._M_allocated_capacity = *plVar17;
          local_298._M_dataplus._M_p = (pointer)*plVar14;
        }
        local_298._M_string_length = plVar14[1];
        *plVar14 = (long)plVar17;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_298._M_dataplus._M_p,
                            local_298._M_string_length);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,", domain elements are:",0x16);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
        std::ostream::put('X');
        std::ostream::flush();
        pCVar23 = pSVar9->_entries;
        pCVar4 = pSVar9->_afterLast;
        if (pCVar23 != pCVar4) {
          uVar19 = 1;
          do {
            if (1 < pCVar23->code) {
              this = pCVar23->value;
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    ",4);
              Kernel::Term::toString_abi_cxx11_(&local_298,this,true);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cout,local_298._M_dataplus._M_p,
                                  local_298._M_string_length);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
              std::ostream::put((char)poVar7);
              std::ostream::flush();
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_298._M_dataplus._M_p != &local_298.field_2) {
                operator_delete(local_298._M_dataplus._M_p,
                                local_298.field_2._M_allocated_capacity + 1);
              }
              local_298._M_dataplus._M_p = (pointer)this;
              uVar24 = 0x811c9dc5;
              lVar6 = 0;
              do {
                uVar24 = (*(byte *)((long)&local_298._M_dataplus._M_p + lVar6) ^ uVar24) * 0x1000193
                ;
                lVar6 = lVar6 + 1;
              } while (lVar6 != 8);
              Lib::Set<Kernel::Term*,Lib::DefaultHash>::
              rawFindOrInsert<Lib::Set<Kernel::Term*,Lib::DefaultHash>::insert(Kernel::Term*,unsigned_int)::_lambda()_1_,Lib::Set<Kernel::Term*,Lib::DefaultHash>::insert(Kernel::Term*,unsigned_int)::_lambda(auto:1)_1_>
                        ((Set<Kernel::Term*,Lib::DefaultHash> *)local_240,
                         (anon_class_8_1_ba1d8281)&local_298,uVar24,
                         (anon_class_8_1_ba1d8281)&local_298,(bool *)&local_270);
              Lib::DHMap<Kernel::Term_*,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                        (&local_1b8,this,uVar19);
              local_298._M_dataplus._M_p = (pointer)0x0;
              local_298._M_string_length = 0;
              local_298.field_2._M_allocated_capacity = 0;
              FiniteModelMultiSorted::addFunctionDefinition
                        ((FiniteModelMultiSorted *)local_110,this->_functor,
                         (DArray<unsigned_int> *)&local_298,uVar19);
              if ((undefined8 *)local_298.field_2._M_allocated_capacity != (undefined8 *)0x0) {
                uVar21 = local_298._M_string_length * 4 + 0xf & 0xfffffffffffffff0;
                if (uVar21 == 0) {
                  *(undefined8 *)local_298.field_2._M_allocated_capacity =
                       Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
                  Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ =
                       local_298.field_2._M_allocated_capacity;
                }
                else if (uVar21 < 0x11) {
                  *(undefined8 *)local_298.field_2._M_allocated_capacity =
                       Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
                  Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ =
                       local_298.field_2._M_allocated_capacity;
                }
                else if (uVar21 < 0x19) {
                  *(undefined8 *)local_298.field_2._M_allocated_capacity =
                       Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
                  Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ =
                       local_298.field_2._M_allocated_capacity;
                }
                else if (uVar21 < 0x21) {
                  *(undefined8 *)local_298.field_2._M_allocated_capacity =
                       Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
                  Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ =
                       local_298.field_2._M_allocated_capacity;
                }
                else if (uVar21 < 0x31) {
                  *(undefined8 *)local_298.field_2._M_allocated_capacity =
                       Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
                  Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ =
                       local_298.field_2._M_allocated_capacity;
                }
                else if (uVar21 < 0x41) {
                  *(undefined8 *)local_298.field_2._M_allocated_capacity =
                       Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
                  Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ =
                       local_298.field_2._M_allocated_capacity;
                }
                else {
                  operator_delete((void *)local_298.field_2._M_allocated_capacity,0x10);
                }
              }
              uVar19 = uVar19 + 1;
            }
            pCVar23 = pCVar23 + 1;
          } while (pCVar23 != pCVar4);
        }
        ppuVar11 = (undefined **)*plVar10;
        pUVar22 = local_248;
      }
      if (pUVar22 != (UnitList *)0x0) {
        pLVar25 = local_248;
        do {
          pUVar3 = pLVar25->_head;
          pLVar25 = pLVar25->_tail;
          if (((undefined1  [48])pUVar3->_inference & (undefined1  [48])0x1c) ==
              (undefined1  [48])0x18) {
            local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
            local_298._M_string_length = 0;
            local_298.field_2._M_allocated_capacity =
                 local_298.field_2._M_allocated_capacity & 0xffffffffffffff00;
            Parse::TPTP::findAxiomName(pUVar3,&local_298);
            local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"finite_domain","")
            ;
            lVar6 = std::__cxx11::string::rfind
                              ((char *)&local_298,(ulong)local_270._M_dataplus._M_p,0);
            if (lVar6 == 0) {
              bVar27 = true;
            }
            else {
              local_1d8[0] = local_1c8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1d8,"distinct_domain","");
              lVar6 = std::__cxx11::string::rfind((char *)&local_298,(ulong)local_1d8[0],0);
              bVar27 = lVar6 == 0;
              if (local_1d8[0] != local_1c8) {
                operator_delete(local_1d8[0],local_1c8[0] + 1);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_270._M_dataplus._M_p != &local_270.field_2) {
              operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1
                             );
            }
            if (!bVar27) {
              if ((pUVar3->field_0x4 & 1) == 0) {
                puVar16 = (undefined8 *)__cxa_allocate_exception(0x50);
                *puVar16 = &PTR_cry_00b3dfc0;
                puVar16[1] = puVar16 + 3;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)(puVar16 + 1),"Expecting model to use formulas i.e. fof/tff",""
                          );
                *puVar16 = &PTR_cry_00b3e0a8;
                *(undefined4 *)(puVar16 + 5) = 0;
                puVar16[6] = puVar16 + 8;
                puVar16[7] = 0;
                *(undefined1 *)(puVar16 + 8) = 0;
                __cxa_throw(puVar16,&Lib::UserErrorException::typeinfo,
                            Lib::UserErrorException::~UserErrorException);
              }
              pFVar8 = Kernel::Unit::getFormula(pUVar3);
              CVar1 = pFVar8->_connective;
              if (CVar1 == LITERAL) {
                addDefinition((FiniteModelMultiSorted *)local_110,*(Literal **)(pFVar8 + 1),false,
                              (Set<Kernel::Term_*,_Lib::DefaultHash> *)local_240,&local_1b8);
              }
              else if (CVar1 == AND) {
                puVar16 = *(undefined8 **)(pFVar8 + 1);
                while (puVar16 != (undefined8 *)0x0) {
                  piVar15 = (int *)*puVar16;
                  iVar18 = *piVar15;
                  iVar2 = iVar18;
                  if (iVar18 == 6) {
                    piVar15 = *(int **)(piVar15 + 10);
                    iVar2 = *piVar15;
                  }
                  if (iVar2 != 0) {
                    puVar16 = (undefined8 *)__cxa_allocate_exception(0x50);
                    *puVar16 = &PTR_cry_00b3dfc0;
                    puVar16[1] = puVar16 + 3;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)(puVar16 + 1),"Badly formed definition","");
                    *puVar16 = &PTR_cry_00b3e0a8;
                    *(undefined4 *)(puVar16 + 5) = 0;
                    puVar16[6] = puVar16 + 8;
                    puVar16[7] = 0;
                    *(undefined1 *)(puVar16 + 8) = 0;
                    __cxa_throw(puVar16,&Lib::UserErrorException::typeinfo,
                                Lib::UserErrorException::~UserErrorException);
                  }
                  puVar16 = (undefined8 *)puVar16[1];
                  addDefinition((FiniteModelMultiSorted *)local_110,*(Literal **)(piVar15 + 10),
                                iVar18 == 6,(Set<Kernel::Term_*,_Lib::DefaultHash> *)local_240,
                                &local_1b8);
                }
              }
              else {
                if (CVar1 != NOT) {
                  puVar16 = (undefined8 *)__cxa_allocate_exception(0x50);
                  Kernel::Formula::toString_abi_cxx11_(&local_270,pFVar8);
                  std::operator+(&local_150,"Expecting conjunction of definitions in model:\n",
                                 &local_270);
                  *puVar16 = &PTR_cry_00b3dfc0;
                  puVar16[1] = puVar16 + 3;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)(puVar16 + 1),local_150._M_dataplus._M_p,
                             local_150._M_dataplus._M_p + local_150._M_string_length);
                  *puVar16 = &PTR_cry_00b3e0a8;
                  *(undefined4 *)(puVar16 + 5) = 0;
                  puVar16[6] = puVar16 + 8;
                  puVar16[7] = 0;
                  *(undefined1 *)(puVar16 + 8) = 0;
                  __cxa_throw(puVar16,&Lib::UserErrorException::typeinfo,
                              Lib::UserErrorException::~UserErrorException);
                }
                if (**(int **)(pFVar8 + 1) != 0) {
                  puVar16 = (undefined8 *)__cxa_allocate_exception(0x50);
                  Kernel::Formula::toString_abi_cxx11_(&local_270,pFVar8);
                  std::operator+(&local_130,"Unexpected negation in ",&local_270);
                  *puVar16 = &PTR_cry_00b3dfc0;
                  puVar16[1] = puVar16 + 3;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)(puVar16 + 1),local_130._M_dataplus._M_p,
                             local_130._M_dataplus._M_p + local_130._M_string_length);
                  *puVar16 = &PTR_cry_00b3e0a8;
                  *(undefined4 *)(puVar16 + 5) = 0;
                  puVar16[6] = puVar16 + 8;
                  puVar16[7] = 0;
                  *(undefined1 *)(puVar16 + 8) = 0;
                  __cxa_throw(puVar16,&Lib::UserErrorException::typeinfo,
                              Lib::UserErrorException::~UserErrorException);
                }
                addDefinition((FiniteModelMultiSorted *)local_110,
                              *(Literal **)(*(int **)(pFVar8 + 1) + 10),true,
                              (Set<Kernel::Term_*,_Lib::DefaultHash> *)local_240,&local_1b8);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._M_dataplus._M_p != &local_298.field_2) {
              operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1
                             );
            }
          }
        } while (pLVar25 != (List<Kernel::Unit_*> *)0x0);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Model loaded",0xc);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
      std::ostream::put('X');
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Checking formulas...",0x14);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
      std::ostream::put('X');
      std::ostream::flush();
      if (local_248 == (UnitList *)0x0) {
        lVar6 = 0x1f;
        pcVar20 = "All formulas evaluated to True!";
      }
      else {
        bVar26 = 1;
        pLVar25 = local_248;
        do {
          pUVar3 = pLVar25->_head;
          pLVar25 = pLVar25->_tail;
          if (((undefined1  [48])pUVar3->_inference & (undefined1  [48])0x1c) !=
              (undefined1  [48])0x18) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Checking ",9);
            Kernel::Unit::toString_abi_cxx11_(&local_298,pUVar3);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,local_298._M_dataplus._M_p,
                                local_298._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"...",3);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._M_dataplus._M_p != &local_298.field_2) {
              operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1
                             );
            }
            bVar27 = FiniteModelMultiSorted::evaluate((FiniteModelMultiSorted *)local_110,pUVar3);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Evaluates to ",0xd);
            pcVar20 = "False";
            if (bVar27) {
              pcVar20 = "True";
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,pcVar20,(ulong)bVar27 ^ 5);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
            std::ostream::put('X');
            std::ostream::flush();
            bVar26 = bVar26 & bVar27;
          }
        } while (pLVar25 != (List<Kernel::Unit_*> *)0x0);
        pcVar20 = "There was a false formula!";
        if (bVar26 != 0) {
          pcVar20 = "All formulas evaluated to True!";
        }
        lVar6 = (ulong)bVar26 * 5 + 0x1a;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar20,lVar6);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
      std::ostream::put('X');
      std::ostream::flush();
      plVar14 = plVar10 + 1;
      *(int *)plVar14 = (int)*plVar14 + -1;
      if ((int)*plVar14 == 0) {
        (**(code **)(*plVar10 + 8))(plVar10);
      }
      Lib::DHMap<Kernel::Term_*,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
                (&local_1b8);
      if ((undefined8 *)local_230._0_8_ != (undefined8 *)0x0) {
        if ((long)(int)local_240._0_4_ == 0) {
          *(undefined8 *)local_230._0_8_ = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_230._0_8_;
        }
        else {
          uVar21 = (long)(int)local_240._0_4_ * 0x10;
          if (uVar21 < 0x11) {
            *(undefined8 *)local_230._0_8_ = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
            Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_230._0_8_;
          }
          else if (uVar21 < 0x19) {
            *(undefined8 *)local_230._0_8_ = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
            Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_230._0_8_;
          }
          else if (uVar21 < 0x21) {
            *(undefined8 *)local_230._0_8_ = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
            Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_230._0_8_;
          }
          else if (uVar21 < 0x31) {
            *(undefined8 *)local_230._0_8_ = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
            Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_230._0_8_;
          }
          else if (uVar21 < 0x41) {
            *(undefined8 *)local_230._0_8_ = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
            Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_230._0_8_;
          }
          else {
            operator_delete((void *)local_230._0_8_,0x10);
          }
        }
      }
      FiniteModelMultiSorted::~FiniteModelMultiSorted((FiniteModelMultiSorted *)local_110);
      if (local_208 != (undefined8 *)0x0) {
        uVar21 = (long)local_210 * 4 + 0xfU & 0xfffffffffffffff0;
        if (uVar21 == 0) {
          *local_208 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_208;
        }
        else if (uVar21 < 0x11) {
          *local_208 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_208;
        }
        else if (uVar21 < 0x19) {
          *local_208 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_208;
        }
        else if (uVar21 < 0x21) {
          *local_208 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_208;
        }
        else if (uVar21 < 0x31) {
          *local_208 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_208;
        }
        else if (uVar21 < 0x41) {
          *local_208 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_208;
        }
        else {
          operator_delete(local_208,0x10);
        }
      }
      Lib::
      DHMap<unsigned_int,_std::unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
      ::~DHMap(&local_178);
      Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
                (&local_200);
      return;
    }
  }
  puVar16 = (undefined8 *)__cxa_allocate_exception(0x50);
  *puVar16 = &PTR_cry_00b3dfc0;
  puVar16[1] = puVar16 + 3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(puVar16 + 1),
             "No domain definition found!\n Use vampire(model_check,model_start). MODEL_DEFINITION_FORMULAS. vampire(model_check,model_end)."
             ,"");
  *puVar16 = &PTR_cry_00b3e0a8;
  *(undefined4 *)(puVar16 + 5) = 0;
  puVar16[6] = puVar16 + 8;
  puVar16[7] = 0;
  *(undefined1 *)(puVar16 + 8) = 0;
  __cxa_throw(puVar16,&Lib::UserErrorException::typeinfo,
              Lib::UserErrorException::~UserErrorException);
}

Assistant:

static void doCheck(UnitList* units)
{
  // find model size
  // looking for a domain axiom with a name starting 'finite_domain' (TODO search for something of the right shape)

  DHMap<unsigned,unsigned> sortSizes;
  DHMap<unsigned,std::unique_ptr<Set<Term*>>> domainConstantsPerSort;

  // first just search for finite_domain axiom (TODO: do this for every sort!)
  {
    UnitList::Iterator uit(units);
    while(uit.hasNext()){
      Unit* u = uit.next();
      if(u->inputType()!= UnitInputType::MODEL_DEFINITION) continue;
      std::string name;
      ALWAYS(Parse::TPTP::findAxiomName(u,name));
      if(StringUtils::starts_with(name,"finite_domain")){
        std::cout << "Finite domain axiom found:" << std::endl << u->toString() << std::endl;
        // Set model size and domainConstants
        // And check it is a finite domain axiom
        if(u->isClause()) USER_ERROR("finite_domain in cnf (use fof/tff instead)");

        Formula* formula = u->getFormula();
        if(formula->connective()!=Connective::FORALL) USER_ERROR("finite_domain is not a domain axiom");
        Formula* subformula = formula->qarg();

        if (VList::length(formula->vars()) != 1) USER_ERROR("finite_domain must start with forall over a single variable");
        unsigned curSort = (formula->sorts()) ? formula->sorts()->head().term()->functor() : env.signature->getDefaultSort();

        unsigned curModelSize = 0;
        auto curDomainConstants = std::make_unique<Set<Term*>>();

        int single_var = -1;
        if (subformula->connective()==Connective::OR) {
          FormulaList* args = subformula->args();
          FormulaList::Iterator fit(args);
          while(fit.hasNext()){
            curModelSize++;
            Formula* arg = fit.next();
            if(arg->connective()!=Connective::LITERAL) USER_ERROR("finite_domain is not a domain axiom");
            Literal* l = arg->literal();
            checkIsDomainLiteral(l,single_var,*curDomainConstants);
          }
        } else if (subformula->connective()==Connective::LITERAL) {
          curModelSize = 1;
          checkIsDomainLiteral(subformula->literal(),single_var,*curDomainConstants);
        } else USER_ERROR("finite_domain is not a domain axiom");

        sortSizes.set(curSort,curModelSize);
        domainConstantsPerSort.set(curSort,std::move(curDomainConstants));
      }
    }
  }

  if (sortSizes.size() == 0) {
    USER_ERROR("No domain definition found!\n Use vampire(model_check,model_start). MODEL_DEFINITION_FORMULAS. vampire(model_check,model_end).");
  }

  std::cout << "Loading model..." << std::endl;
  DArray<unsigned> sortSizesArray(env.signature->typeCons());
  {
    auto it = sortSizes.items();
    while (it.hasNext()) {
      auto [sort,curModelSize] = it.next();
      sortSizesArray[sort] = curModelSize;
    }
  }
  // TODO can we pass a reference here instead of clone()ing?
  FiniteModelMultiSorted model(sortSizesArray.clone());

  Set<Term*> domainConstants; // union of all the perSort ones
  DHMap<Term*,unsigned> domainConstantNumber;

  std::cout << "Detected model with " << sortSizes.size() << " sorts." << std::endl;
  auto it = sortSizes.items();
  while (it.hasNext()) {
    auto [sort,curModelSize] = it.next();
    auto& curDomainConstants = *domainConstantsPerSort.get(sort);
    ASS_EQ(curModelSize,(unsigned)curDomainConstants.size());

    std::cout << "  domain for " + env.signature->getTypeCon(sort)->name() + " of size " << curModelSize;
    std::cout << ", domain elements are:" << std::endl;

    // number the domain constants
    Set<Term*>::Iterator dit(curDomainConstants);
    unsigned count=1;
    while(dit.hasNext()){
      Term* con = dit.next();
      std::cout << "    " << con->toString() << std::endl;
      domainConstants.insert(con);
      domainConstantNumber.insert(con,count);
      model.addFunctionDefinition(con->functor(),DArray<unsigned>(0),count);
      count++;
    }
  }

  {
    UnitList::Iterator uit(units);
    while(uit.hasNext()){
      Unit* u = uit.next();
      if(u->inputType()!= UnitInputType::MODEL_DEFINITION) continue;
      std::string name;
      ALWAYS(Parse::TPTP::findAxiomName(u,name));
      if(StringUtils::starts_with(name,"finite_domain") || StringUtils::starts_with(name,"distinct_domain")) continue;

      // All model formulas should be conjunctions of definitions
      // TODO allow for unit clause definitions in the future
      if(u->isClause()) USER_ERROR("Expecting model to use formulas i.e. fof/tff");
      Formula* formula = u->getFormula();

      if(formula->connective()==Connective::NOT){
        Formula* inner = formula->uarg();
        if(inner->connective()==Connective::LITERAL){
          addDefinition(model,inner->literal(),true,domainConstants,domainConstantNumber);
        }
        else USER_ERROR("Unexpected negation in "+formula->toString());
      }
      else if(formula->connective()==Connective::LITERAL){
        addDefinition(model,formula->literal(),false,domainConstants,domainConstantNumber);
      }
      else{
        if(formula->connective()!=Connective::AND)
          USER_ERROR("Expecting conjunction of definitions in model:\n"+formula->toString());
        FormulaList* defs = formula->args();
        FormulaList::Iterator fit(defs);
        while(fit.hasNext()){
          unsigned negated = false;
          Formula* def = fit.next();
          if(def->connective()==Connective::NOT){
            def = def->uarg();
            negated=true;
          }
          if(def->connective()!=Connective::LITERAL) USER_ERROR("Badly formed definition");
          Literal* lit = def->literal();
          addDefinition(model,lit,negated,domainConstants,domainConstantNumber);
        }
      }
    }
    std::cout << "Model loaded" << std::endl;
    std::cout << "Checking formulas..." << std::endl;
    {
      bool allTrue = true;
      UnitList::Iterator uit(units);
      while(uit.hasNext()){
        Unit* u = uit.next();
        if(u->inputType()== UnitInputType::MODEL_DEFINITION) continue;

        std::cout << "Checking " << u->toString() << "..." << std::endl;
        bool res = model.evaluate(u);
        allTrue &= res;
        std::cout << "Evaluates to " << (res ? "True" : "False") << std::endl;
      }
      if (allTrue) {
        std::cout << "All formulas evaluated to True!" << std::endl;
      } else {
        std::cout << "There was a false formula!" << std::endl;
      }
    }
  }
}